

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O1

void __thiscall CTcSrcFile::~CTcSrcFile(CTcSrcFile *this)

{
  uint *puVar1;
  CCharmapToUni *pCVar2;
  
  (this->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_0035eff0;
  if (this->fp_ != (CVmDataSource *)0x0) {
    (*this->fp_->_vptr_CVmDataSource[1])();
  }
  pCVar2 = this->mapper_;
  if (pCVar2 != (CCharmapToUni *)0x0) {
    puVar1 = &(pCVar2->super_CCharmap).ref_cnt_;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pCVar2->super_CCharmap)._vptr_CCharmap[1])();
      return;
    }
  }
  return;
}

Assistant:

CTcSrcFile::~CTcSrcFile()
{
    /* close my source file */
    if (fp_ != 0)
        delete fp_;

    /* release my character mapper */
    if (mapper_ != 0)
        mapper_->release_ref();
}